

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int memdbFetch(sqlite3_file *pFile,sqlite3_int64 iOfst,int iAmt,void **pp)

{
  sqlite3_io_methods *psVar1;
  _func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *p_Var2;
  
  psVar1 = pFile[1].pMethods;
  if ((sqlite3_mutex *)psVar1->xTruncate != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar1->xTruncate);
  }
  if ((*(long *)psVar1 < iAmt + iOfst) || (((ulong)psVar1->xSync & 0x200000000) != 0)) {
    p_Var2 = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
  }
  else {
    *(int *)&psVar1->xSync = *(int *)&psVar1->xSync + 1;
    p_Var2 = psVar1->xWrite + iOfst;
  }
  *pp = p_Var2;
  if ((sqlite3_mutex *)psVar1->xTruncate != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar1->xTruncate);
  }
  return 0;
}

Assistant:

static int memdbFetch(
  sqlite3_file *pFile,
  sqlite3_int64 iOfst,
  int iAmt,
  void **pp
){
  MemStore *p = ((MemFile*)pFile)->pStore;
  memdbEnter(p);
  if( iOfst+iAmt>p->sz || (p->mFlags & SQLITE_DESERIALIZE_RESIZEABLE)!=0 ){
    *pp = 0;
  }else{
    p->nMmap++;
    *pp = (void*)(p->aData + iOfst);
  }
  memdbLeave(p);
  return SQLITE_OK;
}